

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O2

void is_suite::is_string(void)

{
  variable data;
  undefined1 local_3a;
  undefined1 local_39;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_38;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_38,"alpha");
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                       ((basic_variable<std::allocator<char>_> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x48e,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x48f,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x490,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string&>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x491,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string_const>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x492,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x493,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string_volatile>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x494,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::
             is<std::__cxx11::string_volatile&>((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x495,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                       ((basic_variable<std::allocator<char>_> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x497,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::wstring>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::wstring>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x498,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::wstring>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::wstring_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x499,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                       ((basic_variable<std::allocator<char>_> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49b,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u16string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::u16string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49c,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u16string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::u16string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49d,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                       ((basic_variable<std::allocator<char>_> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49f,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u32string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::u32string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a0,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u32string>
                       ((basic_variable<std::allocator<char>> *)&local_38);
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::u32string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a1,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = local_38.current == '\x0f';
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a3,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a4,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const variable::string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a5,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a6,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile variable::string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a7,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a8,"void is_suite::is_string()",&local_39,&local_3a);
  local_39 = local_38.current == '\x10';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::wstring_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4aa,"void is_suite::is_string()",&local_39,&local_3a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_38);
  return;
}

Assistant:

void is_string()
{
    variable data("alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::string>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::string_type&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const variable::string_type&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile variable::string_type&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::wstring>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::wstring_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::u16string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::u16string_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::u32string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::u32string_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::string_type&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const variable::string_type>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const variable::string_type&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile variable::string_type>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile variable::string_type&>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::wstring_type>(), false);
}